

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_line_buffer.cpp
# Opt level: O1

void __thiscall
NshLineBufferAppendNull_SuccessEndOfBuffer_Test::TestBody
          (NshLineBufferAppendNull_SuccessEndOfBuffer_Test *this)

{
  int iVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  nsh_line_buffer_t line;
  Message local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  nsh_line_buffer_t local_b4;
  
  nsh_line_buffer_reset(&local_b4);
  iVar1 = 0x7f;
  do {
    local_d8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = nsh_line_buffer_append_char(&local_b4,'a');
    local_d0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<nsh_status,nsh_status>
              (local_c8,"nsh_line_buffer_append_char(&line, \'a\')","NSH_STATUS_OK",
               (nsh_status *)&local_d8,(nsh_status *)&local_d0);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message(&local_d8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_line_buffer.cpp"
                 ,0x59,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
      goto LAB_0011e0c0;
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  nsh_line_buffer_append_null(&local_b4);
  local_d8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_c8,"line.size","128u",&local_b4.size,(uint *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message(&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_line_buffer.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
  }
  else {
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_d8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_d8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,0x61);
    testing::internal::CmpHelperEQ<char,char>
              (local_c8,"line.buffer[128u - 2]","\'a\'",local_b4.buffer + 0x7e,(char *)&local_d8);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message(&local_d8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_line_buffer.cpp"
                 ,0x5e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
    }
    else {
      if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c0,local_c0);
      }
      local_d8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           (nsh_status_t)
           local_d8.ss_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl & 0xffffff00;
      testing::internal::CmpHelperEQ<char,char>
                (local_c8,"line.buffer[128u - 1]","\'\\0\'",local_b4.buffer + 0x7f,(char *)&local_d8
                );
      if (local_c8[0] != (internal)0x0) goto LAB_0011e0d9;
      testing::Message::Message(&local_d8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_line_buffer.cpp"
                 ,0x5f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_d8);
    }
  }
LAB_0011e0c0:
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((long *)CONCAT44(local_d8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (nsh_status_t)
                       local_d8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_d8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (nsh_status_t)
                                   local_d8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) + 8))();
  }
LAB_0011e0d9:
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  return;
}

Assistant:

TEST(NshLineBufferAppendNull, SuccessEndOfBuffer)
{
    nsh_line_buffer_t line;
    nsh_line_buffer_reset(&line);

    for (unsigned int i = 0; i < NSH_LINE_BUFFER_SIZE - 1; i++) {
        ASSERT_EQ(nsh_line_buffer_append_char(&line, 'a'), NSH_STATUS_OK);
    }
    nsh_line_buffer_append_null(&line);

    ASSERT_EQ(line.size, NSH_LINE_BUFFER_SIZE);
    ASSERT_EQ(line.buffer[NSH_LINE_BUFFER_SIZE - 2], 'a');
    ASSERT_EQ(line.buffer[NSH_LINE_BUFFER_SIZE - 1], '\0');
}